

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O1

void Abc_EnumerateCubeStatesZdd(void)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Abc_ZddMan *p;
  uint uVar7;
  long lVar8;
  int level;
  undefined4 *puVar9;
  int ZddAllPrev;
  int iVar10;
  long lVar11;
  ulong uVar12;
  timespec ts_2;
  int pPerm [24];
  int pComb [9];
  long local_d8;
  timespec local_c8;
  timespec local_b8 [6];
  uint local_58 [10];
  
  iVar2 = clock_gettime(3,local_b8);
  lVar8 = -1;
  local_d8 = -1;
  if (-1 < iVar2) {
    local_d8 = local_b8[0].tv_nsec / 1000 + local_b8[0].tv_sec * 1000000;
  }
  puts("Enumerating states of 2x2x2 cube.");
  p = Abc_ZddManAlloc(0x114,0x8000000);
  Abc_ZddManCreatePerms(p,0x18);
  iVar3 = 1;
  printf("Iter %2d -> %8d  Nodes = %7d  Used = %10d  ",0,1,0,2);
  iVar4 = 3;
  iVar2 = clock_gettime(3,local_b8);
  if (-1 < iVar2) {
    lVar8 = local_b8[0].tv_nsec / 1000 + local_b8[0].tv_sec * 1000000;
  }
  lVar11 = 0;
  Abc_Print(iVar4,"%s =","Time");
  Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar8 - local_d8) / 1000000.0);
  puVar9 = &DAT_008bc384;
  do {
    lVar8 = 0;
    do {
      *(int *)((long)&local_b8[0].tv_sec + lVar8 * 4) = (int)lVar8;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x18);
    lVar8 = 0;
    do {
      uVar1 = *(undefined4 *)((long)local_b8 + (long)(int)puVar9[lVar8 * 2 + -1] * 4 + -4);
      iVar2 = puVar9[lVar8 * 2];
      *(undefined4 *)((long)local_b8 + (long)(int)puVar9[lVar8 * 2 + -1] * 4 + -4) =
           *(undefined4 *)((long)local_b8 + (long)iVar2 * 4 + -4);
      *(undefined4 *)((long)local_b8 + (long)iVar2 * 4 + -4) = uVar1;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 9);
    iVar2 = Abc_ZddPerm2Comb((int *)local_b8,0x18,(int *)local_58);
    if (iVar2 != 9) {
      __assert_fail("nSize == 9",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilPerm.c"
                    ,0x36b,"void Abc_EnumerateCubeStatesZdd()");
    }
    lVar8 = 0;
    do {
      uVar7 = local_58[lVar8] & 0xffff;
      iVar2 = (int)local_58[lVar8] >> 0x10;
      if ((int)uVar7 <= iVar2) {
        __assert_fail("i < j",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilPerm.c"
                      ,0x65,"int Abc_ZddVarIJ(Abc_ZddMan *, int, int)");
      }
      local_58[lVar8] = p->pT2V[(int)(iVar2 * p->nPermSize + uVar7)];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 9);
    iVar2 = Abc_ZddBuildSet(p,(int *)local_58,9);
    iVar3 = Abc_ZddUnion(p,iVar3,iVar2);
    iVar4 = Abc_ZddPermProduct(p,iVar2,iVar2);
    iVar3 = Abc_ZddUnion(p,iVar3,iVar4);
    iVar2 = Abc_ZddPermProduct(p,iVar4,iVar2);
    iVar3 = Abc_ZddUnion(p,iVar3,iVar2);
    lVar11 = lVar11 + 1;
    puVar9 = puVar9 + 0x12;
  } while (lVar11 != 3);
  uVar7 = Abc_ZddCountPaths(p,iVar3);
  uVar5 = Abc_ZddCount_rec(p,iVar3);
  Abc_ZddUnmark_rec(p,iVar3);
  printf("Iter %2d -> %8d  Nodes = %7d  Used = %10d  ",1,(ulong)uVar7,(ulong)uVar5,
         (ulong)(uint)p->nObjs);
  iVar4 = 3;
  iVar2 = clock_gettime(3,&local_c8);
  if (iVar2 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_c8.tv_nsec / 1000 + local_c8.tv_sec * 1000000;
  }
  Abc_Print(iVar4,"%s =","Time");
  Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar8 - local_d8) / 1000000.0);
  uVar12 = 2;
  iVar2 = iVar3;
  do {
    iVar4 = Abc_ZddPermProduct(p,iVar2,iVar3);
    uVar7 = Abc_ZddCountPaths(p,iVar4);
    uVar5 = Abc_ZddCount_rec(p,iVar4);
    Abc_ZddUnmark_rec(p,iVar4);
    iVar10 = (int)uVar12;
    printf("Iter %2d -> %8d  Nodes = %7d  Used = %10d  ",uVar12,(ulong)uVar7,(ulong)uVar5,
           (ulong)(uint)p->nObjs);
    level = 3;
    iVar6 = clock_gettime(3,&local_c8);
    if (iVar6 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_c8.tv_nsec / 1000 + local_c8.tv_sec * 1000000;
    }
    Abc_Print(level,"%s =","Time");
    Abc_Print(level,"%9.2f sec\n",(double)(lVar8 - local_d8) / 1000000.0);
  } while ((iVar2 != iVar4) && (uVar12 = (ulong)(iVar10 + 1), iVar2 = iVar4, iVar10 != 100));
  Abc_ZddManFree(p);
  return;
}

Assistant:

void Abc_EnumerateCubeStatesZdd()
{
    int pXYZ[3][9][2] = {
        { {3, 5}, {3,17}, {3,15}, {1, 6}, {1,16}, {1,14}, {2, 4}, {2,18}, {2,13} },
        { {2,14}, {2,24}, {2,12}, {3,13}, {3,23}, {3,10}, {1,15}, {1,22}, {1,11} },
        { {1,10}, {1, 7}, {1, 4}, {3,12}, {3, 9}, {3, 6}, {2,11}, {2, 8}, {2, 5} }  };
#ifdef WIN32
    int LogObj = 24;
#else
    int LogObj = 27;
#endif
    Abc_ZddMan * p;
    int i, k, pComb[9], pPerm[24], nSize;
    int ZddTurn1, ZddTurn2, ZddTurn3, ZddTurns, ZddAll;
    abctime clk = Abc_Clock();
    printf( "Enumerating states of 2x2x2 cube.\n" );
    p = Abc_ZddManAlloc( 24 * 23 / 2, 1 << LogObj ); // finished with 2^27 (4 GB)
    Abc_ZddManCreatePerms( p, 24 );
    // init state
    printf( "Iter %2d -> %8d  Nodes = %7d  Used = %10d  ", 0, 1, 0, 2 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // first 9 states
    ZddTurns = 1;
    for ( i = 0; i < 3; i++ )
    {
        for ( k = 0; k < 24; k++ )
            pPerm[k] = k;
        for ( k = 0; k < 9; k++ )
            ABC_SWAP( int, pPerm[pXYZ[i][k][0]-1], pPerm[pXYZ[i][k][1]-1] );
        nSize = Abc_ZddPerm2Comb( pPerm, 24, pComb );
        assert( nSize == 9 );
        for ( k = 0; k < 9; k++ )
            pComb[k] = Abc_ZddVarIJ( p, pComb[k] >> 16, pComb[k] & 0xffff );
        // add first turn
        ZddTurn1  = Abc_ZddBuildSet( p, pComb, 9 );
        ZddTurns = Abc_ZddUnion( p, ZddTurns, ZddTurn1 );
        //Abc_ZddPrint( p, ZddTurn1 );
        // add second turn
        ZddTurn2 = Abc_ZddPermProduct( p, ZddTurn1, ZddTurn1 );
        ZddTurns = Abc_ZddUnion( p, ZddTurns, ZddTurn2 );
        //Abc_ZddPrint( p, ZddTurn2 );
        // add third turn
        ZddTurn3 = Abc_ZddPermProduct( p, ZddTurn2, ZddTurn1 );
        ZddTurns = Abc_ZddUnion( p, ZddTurns, ZddTurn3 );
        //Abc_ZddPrint( p, ZddTurn3 );
        //printf( "\n" );
    }
    //Abc_ZddPrint( p, ZddTurns );
    printf( "Iter %2d -> %8d  Nodes = %7d  Used = %10d  ", 1, Abc_ZddCountPaths(p, ZddTurns), Abc_ZddCountNodes(p, ZddTurns), p->nObjs );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // other states
    ZddAll = ZddTurns;
    for ( i = 2; i <= 100; i++ )
    {
        int ZddAllPrev = ZddAll;
        ZddAll = Abc_ZddPermProduct( p, ZddAll, ZddTurns );
        printf( "Iter %2d -> %8d  Nodes = %7d  Used = %10d  ", i, Abc_ZddCountPaths(p, ZddAll), Abc_ZddCountNodes(p, ZddAll), p->nObjs );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        if ( ZddAllPrev == ZddAll )
            break;
    }
    Abc_ZddManFree( p );
}